

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O0

void ps_check_extra_glyph_name(char *gname,FT_UInt glyph,FT_UInt *extra_glyphs,FT_UInt *states)

{
  int iVar1;
  uint local_2c;
  FT_UInt n;
  FT_UInt *states_local;
  FT_UInt *extra_glyphs_local;
  FT_UInt glyph_local;
  char *gname_local;
  
  local_2c = 0;
  while( true ) {
    if (9 < local_2c) {
      return;
    }
    iVar1 = strcmp("Delta" + ft_extra_glyph_name_offsets[local_2c],gname);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  if (states[local_2c] != 0) {
    return;
  }
  states[local_2c] = 1;
  extra_glyphs[local_2c] = glyph;
  return;
}

Assistant:

static void
  ps_check_extra_glyph_name( const char*  gname,
                             FT_UInt      glyph,
                             FT_UInt*     extra_glyphs,
                             FT_UInt     *states )
  {
    FT_UInt  n;


    for ( n = 0; n < EXTRA_GLYPH_LIST_SIZE; n++ )
    {
      if ( ft_strcmp( ft_extra_glyph_names +
                        ft_extra_glyph_name_offsets[n], gname ) == 0 )
      {
        if ( states[n] == 0 )
        {
          /* mark this extra glyph as a candidate for the cmap */
          states[n]     = 1;
          extra_glyphs[n] = glyph;
        }

        return;
      }
    }
  }